

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O2

void foundit(skiplist<DictKey,_std::less<DictKey>_> *s,DictKey *x)

{
  ostream *poVar1;
  iterator itr;
  iterator local_58;
  undefined1 local_40 [40];
  
  DictKey::DictKey((DictKey *)local_40,x);
  skiplist<DictKey,_std::less<DictKey>_>::find(&local_58,s,(DictKey *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  if ((local_58.node == (SLNode<DictKey> *)0x0) && (local_58.node_count_ == 0)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Not found: ");
    poVar1 = operator<<(poVar1,x);
    std::operator<<(poVar1,"\n");
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Value: ");
    poVar1 = operator<<(poVar1,&(local_58.node)->val);
    poVar1 = std::operator<<(poVar1," Count: ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(local_58.node)->count);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void foundit(skiplist<DictKey> &s, DictKey x) {
  skiplist<DictKey>::iterator itr = s.find(x);
  if (itr != std::end(s))
    std::cout << "Value: " << itr.node->val << " Count: " << itr.node->count
         << std::endl;
  else
    std::cout << "Not found: " << x << "\n";
}